

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O1

void __thiscall ViewTest::subViewsTest<true>(ViewTest *this)

{
  pointer piVar1;
  int iVar2;
  uint uVar3;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var5;
  reference piVar6;
  size_t sVar7;
  size_t sVar8;
  logic_error *plVar9;
  code *pcVar10;
  int iVar11;
  size_t sVar12;
  value_type *__val_8;
  undefined *puVar13;
  value_type *__val;
  value_type *__val_1;
  long lVar14;
  bool bVar15;
  View<int,_true,_std::allocator<unsigned_long>_> s;
  View<int,_true,_std::allocator<unsigned_long>_> v;
  int local_e4;
  View<int,_true,_std::allocator<unsigned_long>_> local_e0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_98;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  undefined1 local_88 [16];
  size_t *local_78;
  size_t local_60;
  unsigned_long *local_48;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_40;
  unsigned_long *local_38;
  
  _Var4._M_current = (unsigned_long *)operator_new(8);
  *_Var4._M_current = 0x18;
  local_a0._M_current = (unsigned_long *)this->data_;
  local_88._0_8_ = local_a0._M_current;
  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
              )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
             (allocator_type *)&local_e0);
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
  _Var5._M_current = (unsigned_long *)operator_new(8);
  *_Var5._M_current = 4;
  *_Var4._M_current = 1;
  local_e0.data_ = (pointer)0x0;
  local_e0.geometry_.shape_ = (size_t *)0x0;
  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
  local_e0.geometry_.strides_ = (size_t *)0x0;
  local_e0.geometry_.dimension_ = 0;
  local_e0.geometry_.size_ = 0;
  local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
  local_e0.geometry_.isSimple_ = true;
  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_e0);
  andres::View<int,true,std::allocator<unsigned_long>>::
  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,_Var4,&local_e0);
  if (local_e0.geometry_.size_ == 1) {
    if (local_e0.data_ == (pointer)0x0) {
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
      pcVar10 = std::runtime_error::~runtime_error;
      puVar13 = &std::runtime_error::typeinfo;
      goto LAB_0019f576;
    }
    if (local_e0.geometry_.dimension_ == 1) {
      local_e4 = 0;
      piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
               execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
      if (*piVar6 != 4) {
        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
        std::logic_error::logic_error(plVar9,"test failed.");
        __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
      operator_delete(local_e0.geometry_.shape_,local_e0.geometry_.dimension_ * 0x18);
      operator_delete(_Var5._M_current,8);
      operator_delete(local_78,local_60 * 0x18);
      operator_delete(_Var4._M_current,8);
      _Var4._M_current = (unsigned_long *)operator_new(8);
      *_Var4._M_current = 0x18;
      local_e0.data_ = (pointer)((ulong)local_e0.data_ & 0xffffffff00000000);
      local_88._0_8_ = local_a0._M_current;
      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  )(_Var4._M_current + 1),(CoordinateOrder *)&local_e0,&andres::defaultOrder,
                 (allocator_type *)&local_e4);
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
      _Var5._M_current = (unsigned_long *)operator_new(8);
      *_Var5._M_current = 4;
      *_Var4._M_current = 1;
      local_e0.data_ = (pointer)0x0;
      local_e0.geometry_.shape_ = (size_t *)0x0;
      local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
      local_e0.geometry_.strides_ = (size_t *)0x0;
      local_e0.geometry_.dimension_ = 0;
      local_e0.geometry_.size_ = 0;
      local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
      local_e0.geometry_.isSimple_ = true;
      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_e0);
      andres::View<int,true,std::allocator<unsigned_long>>::
      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,_Var4,&local_e0);
      if (local_e0.geometry_.size_ == 1) {
        if (local_e0.data_ == (pointer)0x0) {
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
          pcVar10 = std::runtime_error::~runtime_error;
          puVar13 = &std::runtime_error::typeinfo;
          goto LAB_0019f5da;
        }
        if (local_e0.geometry_.dimension_ == 1) {
          local_e4 = 0;
          piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                   execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
          if (*piVar6 != 4) {
            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
            std::logic_error::logic_error(plVar9,"test failed.");
            __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
          }
          operator_delete(local_e0.geometry_.shape_,local_e0.geometry_.dimension_ * 0x18);
          operator_delete(_Var5._M_current,8);
          operator_delete(local_78,local_60 * 0x18);
          operator_delete(_Var4._M_current,8);
          _Var4._M_current = (unsigned_long *)operator_new(8);
          *_Var4._M_current = 0x18;
          local_88._0_8_ = local_a0._M_current;
          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
                     (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      )(_Var4._M_current + 1),&andres::defaultOrder,&andres::defaultOrder,
                     (allocator_type *)&local_e0);
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
          _Var5._M_current = (unsigned_long *)operator_new(8);
          *_Var5._M_current = 4;
          *_Var4._M_current = 3;
          local_e0.data_ = (pointer)0x0;
          local_e0.geometry_.shape_ = (size_t *)0x0;
          local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
          local_e0.geometry_.strides_ = (size_t *)0x0;
          local_e0.geometry_.dimension_ = 0;
          local_e0.geometry_.size_ = 0;
          local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
          local_e0.geometry_.isSimple_ = true;
          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_e0);
          andres::View<int,true,std::allocator<unsigned_long>>::
          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                    ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,_Var4,&local_e0)
          ;
          if (local_e0.geometry_.size_ == 3) {
            if (local_e0.data_ == (pointer)0x0) {
              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
              pcVar10 = std::runtime_error::~runtime_error;
              puVar13 = &std::runtime_error::typeinfo;
              goto LAB_0019f63e;
            }
            if (local_e0.geometry_.dimension_ == 1) {
              local_e4 = 0;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
              if (*piVar6 != 4) {
LAB_0019f13c:
                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                std::logic_error::logic_error(plVar9,"test failed.");
                __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
              }
              local_e4 = 1;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
              if (*piVar6 != 5) goto LAB_0019f13c;
              local_e4 = 2;
              piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                       execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
              if (*piVar6 != 6) goto LAB_0019f13c;
              operator_delete(local_e0.geometry_.shape_,local_e0.geometry_.dimension_ * 0x18);
              operator_delete(_Var5._M_current,8);
              operator_delete(local_78,local_60 * 0x18);
              operator_delete(_Var4._M_current,8);
              _Var4._M_current = (unsigned_long *)operator_new(8);
              *_Var4._M_current = 0x18;
              local_e0.data_ = (pointer)((ulong)local_e0.data_ & 0xffffffff00000000);
              local_88._0_8_ = local_a0._M_current;
              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
                         (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                          )(_Var4._M_current + 1),(CoordinateOrder *)&local_e0,&andres::defaultOrder
                         ,(allocator_type *)&local_e4);
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
              _Var5._M_current = (unsigned_long *)operator_new(8);
              *_Var5._M_current = 4;
              *_Var4._M_current = 3;
              local_e0.data_ = (pointer)0x0;
              local_e0.geometry_.shape_ = (size_t *)0x0;
              local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
              local_e0.geometry_.strides_ = (size_t *)0x0;
              local_e0.geometry_.dimension_ = 0;
              local_e0.geometry_.size_ = 0;
              local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
              local_e0.geometry_.isSimple_ = true;
              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_e0);
              andres::View<int,true,std::allocator<unsigned_long>>::
              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                        ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,_Var4,
                         &local_e0);
              if (local_e0.geometry_.size_ == 3) {
                if (local_e0.data_ == (pointer)0x0) {
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.");
                  pcVar10 = std::runtime_error::~runtime_error;
                  puVar13 = &std::runtime_error::typeinfo;
                  goto LAB_0019f670;
                }
                if (local_e0.geometry_.dimension_ == 1) {
                  local_e4 = 0;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
                  if (*piVar6 != 4) {
LAB_0019f16e:
                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                    std::logic_error::logic_error(plVar9,"test failed.");
                    __cxa_throw(plVar9,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                  }
                  local_e4 = 1;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
                  if (*piVar6 != 5) goto LAB_0019f16e;
                  local_e4 = 2;
                  piVar6 = andres::marray_detail::AccessOperatorHelper<true>::
                           execute<int,int,true,std::allocator<unsigned_long>>(&local_e0,&local_e4);
                  if (*piVar6 != 6) goto LAB_0019f16e;
                  operator_delete(local_e0.geometry_.shape_,local_e0.geometry_.dimension_ * 0x18);
                  operator_delete(_Var5._M_current,8);
                  operator_delete(local_78,local_60 * 0x18);
                  operator_delete(_Var4._M_current,8);
                  _Var4._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var4._M_current = 0;
                  _Var4._M_current[1] = 0;
                  *_Var4._M_current = 6;
                  _Var4._M_current[1] = 4;
                  local_88._0_8_ = local_a0._M_current;
                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                              )(_Var4._M_current + 2),&andres::defaultOrder,&andres::defaultOrder,
                             (allocator_type *)&local_e0);
                  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                            ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
                  _Var5._M_current = (unsigned_long *)operator_new(0x10);
                  *_Var5._M_current = 0;
                  _Var5._M_current[1] = 0;
                  *_Var5._M_current = 2;
                  _Var5._M_current[1] = 2;
                  *_Var4._M_current = 1;
                  _Var4._M_current[1] = 1;
                  local_e0.data_ = (pointer)0x0;
                  local_e0.geometry_.shape_ = (size_t *)0x0;
                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                  local_e0.geometry_.strides_ = (size_t *)0x0;
                  local_e0.geometry_.dimension_ = 0;
                  local_e0.geometry_.size_ = 0;
                  local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                  local_e0.geometry_.isSimple_ = true;
                  andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant(&local_e0);
                  andres::View<int,true,std::allocator<unsigned_long>>::
                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                            ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,_Var4,
                             &local_e0);
                  if (local_e0.geometry_.size_ == 1) {
                    if (local_e0.data_ == (pointer)0x0) {
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::runtime_error::runtime_error((runtime_error *)plVar9,"Assertion failed.")
                      ;
                      pcVar10 = std::runtime_error::~runtime_error;
                      puVar13 = &std::runtime_error::typeinfo;
                      goto LAB_0019f6a2;
                    }
                    if (local_e0.geometry_.dimension_ == 2) {
                      piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                                         ((View<int,true,std::allocator<unsigned_long>> *)&local_e0,
                                          0,0);
                      if (*piVar6 != 0xe) {
                        plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                        std::logic_error::logic_error(plVar9,"test failed.");
                        __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                    std::logic_error::~logic_error);
                      }
                      operator_delete(local_e0.geometry_.shape_,local_e0.geometry_.dimension_ * 0x18
                                     );
                      operator_delete(_Var5._M_current,0x10);
                      operator_delete(local_78,local_60 * 0x18);
                      operator_delete(_Var4._M_current,0x10);
                      _Var4._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var4._M_current = 0;
                      _Var4._M_current[1] = 0;
                      *_Var4._M_current = 6;
                      _Var4._M_current[1] = 4;
                      local_e0.data_ = (pointer)((ulong)local_e0.data_ & 0xffffffff00000000);
                      local_88._0_8_ = local_a0._M_current;
                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4,
                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                  )(_Var4._M_current + 2),(CoordinateOrder *)&local_e0,
                                 &andres::defaultOrder,(allocator_type *)&local_e4);
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
                      _Var5._M_current = (unsigned_long *)operator_new(0x10);
                      *_Var5._M_current = 0;
                      _Var5._M_current[1] = 0;
                      *_Var5._M_current = 2;
                      _Var5._M_current[1] = 2;
                      *_Var4._M_current = 1;
                      _Var4._M_current[1] = 1;
                      local_e0.data_ = (pointer)0x0;
                      local_e0.geometry_.shape_ = (size_t *)0x0;
                      local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                      local_e0.geometry_.strides_ = (size_t *)0x0;
                      local_e0.geometry_.dimension_ = 0;
                      local_e0.geometry_.size_ = 0;
                      local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                      local_e0.geometry_.isSimple_ = true;
                      andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                (&local_e0);
                      andres::View<int,true,std::allocator<unsigned_long>>::
                      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,
                                 _Var4,&local_e0);
                      if (local_e0.geometry_.size_ == 1) {
                        if (local_e0.data_ == (pointer)0x0) {
                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::runtime_error::runtime_error
                                    ((runtime_error *)plVar9,"Assertion failed.");
                          pcVar10 = std::runtime_error::~runtime_error;
                          puVar13 = &std::runtime_error::typeinfo;
                          goto LAB_0019f706;
                        }
                        if (local_e0.geometry_.dimension_ == 2) {
                          piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::operator()
                                             ((View<int,true,std::allocator<unsigned_long>> *)
                                              &local_e0,0,0);
                          if (*piVar6 != 10) {
                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                            std::logic_error::logic_error(plVar9,"test failed.");
                            __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                        std::logic_error::~logic_error);
                          }
                          operator_delete(local_e0.geometry_.shape_,
                                          local_e0.geometry_.dimension_ * 0x18);
                          operator_delete(_Var5._M_current,0x10);
                          operator_delete(local_78,local_60 * 0x18);
                          operator_delete(_Var4._M_current,0x10);
                          _Var4._M_current = (unsigned_long *)operator_new(0x10);
                          *_Var4._M_current = 0;
                          _Var4._M_current[1] = 0;
                          *_Var4._M_current = 6;
                          _Var4._M_current[1] = 4;
                          local_88._0_8_ = local_a0._M_current;
                          andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),_Var4
                                     ,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                       )(_Var4._M_current + 2),&andres::defaultOrder,
                                     &andres::defaultOrder,(allocator_type *)&local_e0);
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88);
                          _Var5._M_current = (unsigned_long *)operator_new(0x10);
                          *_Var5._M_current = 0;
                          _Var5._M_current[1] = 0;
                          *_Var4._M_current = 1;
                          _Var4._M_current[1] = 4;
                          local_e0.data_ = (pointer)0x0;
                          local_e0.geometry_.shape_ = (size_t *)0x0;
                          local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                          local_e0.geometry_.strides_ = (size_t *)0x0;
                          local_e0.geometry_.dimension_ = 0;
                          local_e0.geometry_.size_ = 0;
                          local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                          local_e0.geometry_.isSimple_ = true;
                          andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                    (&local_e0);
                          andres::View<int,true,std::allocator<unsigned_long>>::
                          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                    ((View<int,true,std::allocator<unsigned_long>> *)local_88,_Var5,
                                     _Var4,&local_e0);
                          if (local_e0.geometry_.size_ == 4) {
                            if (local_e0.data_ == (pointer)0x0) {
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::runtime_error::runtime_error
                                        ((runtime_error *)plVar9,"Assertion failed.");
                              pcVar10 = std::runtime_error::~runtime_error;
                              puVar13 = &std::runtime_error::typeinfo;
                              goto LAB_0019f76a;
                            }
                            if (local_e0.geometry_.dimension_ == 2) {
                              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                       operator()((View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,0,0);
                              if (*piVar6 != 0) {
LAB_0019f0d8:
                                plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                std::logic_error::logic_error(plVar9,"test failed.");
                                __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                            std::logic_error::~logic_error);
                              }
                              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                       operator()((View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,0,1);
                              if (*piVar6 != 6) goto LAB_0019f0d8;
                              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                       operator()((View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,0,2);
                              if (*piVar6 != 0xc) goto LAB_0019f0d8;
                              piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                       operator()((View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,0,3);
                              if (*piVar6 != 0x12) goto LAB_0019f0d8;
                              operator_delete(local_e0.geometry_.shape_,
                                              local_e0.geometry_.dimension_ * 0x18);
                              operator_delete(_Var5._M_current,0x10);
                              operator_delete(local_78,local_60 * 0x18);
                              operator_delete(_Var4._M_current,0x10);
                              _Var4._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var4._M_current = 0;
                              _Var4._M_current[1] = 0;
                              *_Var4._M_current = 6;
                              _Var4._M_current[1] = 4;
                              local_e0.data_ = (pointer)((ulong)local_e0.data_ & 0xffffffff00000000)
                              ;
                              local_88._0_8_ = local_a0._M_current;
                              andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((Geometry<std::allocator<unsigned_long>> *)(local_88 + 8),
                                         _Var4,(__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                )(_Var4._M_current + 2),(CoordinateOrder *)&local_e0
                                         ,&andres::defaultOrder,(allocator_type *)&local_e4);
                              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                        ((View<int,_true,_std::allocator<unsigned_long>_> *)local_88
                                        );
                              _Var5._M_current = (unsigned_long *)operator_new(0x10);
                              *_Var5._M_current = 0;
                              _Var5._M_current[1] = 0;
                              *_Var4._M_current = 1;
                              _Var4._M_current[1] = 4;
                              local_e0.data_ = (pointer)0x0;
                              local_e0.geometry_.shape_ = (size_t *)0x0;
                              local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                              local_e0.geometry_.strides_ = (size_t *)0x0;
                              local_e0.geometry_.dimension_ = 0;
                              local_e0.geometry_.size_ = 0;
                              local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                              local_e0.geometry_.isSimple_ = true;
                              andres::View<int,_true,_std::allocator<unsigned_long>_>::testInvariant
                                        (&local_e0);
                              andres::View<int,true,std::allocator<unsigned_long>>::
                              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                        ((View<int,true,std::allocator<unsigned_long>> *)local_88,
                                         _Var5,_Var4,&local_e0);
                              if (local_e0.geometry_.size_ == 4) {
                                if (local_e0.data_ == (pointer)0x0) {
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::runtime_error::runtime_error
                                            ((runtime_error *)plVar9,"Assertion failed.");
                                  pcVar10 = std::runtime_error::~runtime_error;
                                  puVar13 = &std::runtime_error::typeinfo;
                                  goto LAB_0019f79c;
                                }
                                if (local_e0.geometry_.dimension_ == 2) {
                                  piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                           operator()((View<int,true,std::allocator<unsigned_long>>
                                                       *)&local_e0,0,0);
                                  if (*piVar6 != 0) {
LAB_0019f10a:
                                    plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                    std::logic_error::logic_error(plVar9,"test failed.");
                                    __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                std::logic_error::~logic_error);
                                  }
                                  piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                           operator()((View<int,true,std::allocator<unsigned_long>>
                                                       *)&local_e0,0,1);
                                  if (*piVar6 != 1) goto LAB_0019f10a;
                                  piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                           operator()((View<int,true,std::allocator<unsigned_long>>
                                                       *)&local_e0,0,2);
                                  if (*piVar6 != 2) goto LAB_0019f10a;
                                  piVar6 = andres::View<int,true,std::allocator<unsigned_long>>::
                                           operator()((View<int,true,std::allocator<unsigned_long>>
                                                       *)&local_e0,0,3);
                                  if (*piVar6 != 3) goto LAB_0019f10a;
                                  operator_delete(local_e0.geometry_.shape_,
                                                  local_e0.geometry_.dimension_ * 0x18);
                                  operator_delete(_Var5._M_current,0x10);
                                  operator_delete(local_78,local_60 * 0x18);
                                  operator_delete(_Var4._M_current,0x10);
                                  local_98._M_current = (unsigned_long *)operator_new(0x10);
                                  *local_98._M_current = 0;
                                  local_98._M_current[1] = 0;
                                  *local_98._M_current = 6;
                                  local_98._M_current[1] = 4;
                                  local_88._0_8_ = local_a0._M_current;
                                  andres::marray_detail::Geometry<std::allocator<unsigned_long>>::
                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((Geometry<std::allocator<unsigned_long>> *)
                                             (local_88 + 8),local_98,
                                             (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                              )(local_98._M_current + 2),&andres::defaultOrder,
                                             &andres::defaultOrder,(allocator_type *)&local_e0);
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant((View<int,_true,_std::allocator<unsigned_long>_> *)
                                                local_88);
                                  _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                  _Var4._M_current = local_98._M_current;
                                  *_Var5._M_current = 0;
                                  _Var5._M_current[1] = 0;
                                  *_Var5._M_current = 2;
                                  _Var5._M_current[1] = 1;
                                  *local_98._M_current = 3;
                                  local_98._M_current[1] = 2;
                                  local_e0.data_ = (pointer)0x0;
                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                  local_e0.geometry_.dimension_ = 0;
                                  local_e0.geometry_.size_ = 0;
                                  local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                                  local_e0.geometry_.isSimple_ = true;
                                  local_90._M_current = _Var5._M_current;
                                  andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                  testInvariant(&local_e0);
                                  andres::View<int,true,std::allocator<unsigned_long>>::
                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                            ((View<int,true,std::allocator<unsigned_long>> *)
                                             local_88,_Var5,_Var4,&local_e0);
                                  if (local_e0.geometry_.size_ == 6) {
                                    if (local_e0.data_ == (pointer)0x0) {
                                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::runtime_error::runtime_error
                                                ((runtime_error *)plVar9,"Assertion failed.");
                                      pcVar10 = std::runtime_error::~runtime_error;
                                      puVar13 = &std::runtime_error::typeinfo;
                                      goto LAB_0019f7ce;
                                    }
                                    if (local_e0.geometry_.dimension_ == 2) {
                                      lVar14 = 0;
                                      iVar2 = 0;
                                      do {
                                        iVar11 = (int)lVar14;
                                        lVar14 = (long)iVar11 + 3;
                                        sVar12 = 0;
                                        do {
                                          piVar6 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,sVar12,iVar2);
                                          if (*piVar6 != (&DAT_002328d0)[sVar12 + (long)iVar11]) {
                                            plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                            std::logic_error::logic_error(plVar9,"test failed.");
                                            __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                        std::logic_error::~logic_error);
                                          }
                                          sVar12 = sVar12 + 1;
                                        } while (sVar12 != 3);
                                        bVar15 = iVar2 == 0;
                                        iVar2 = iVar2 + 1;
                                      } while (bVar15);
                                      operator_delete(local_e0.geometry_.shape_,
                                                      local_e0.geometry_.dimension_ * 0x18);
                                      operator_delete(local_90._M_current,0x10);
                                      operator_delete(local_78,local_60 * 0x18);
                                      operator_delete(local_98._M_current,0x10);
                                      local_98._M_current = (unsigned_long *)operator_new(0x10);
                                      *local_98._M_current = 0;
                                      local_98._M_current[1] = 0;
                                      *local_98._M_current = 6;
                                      local_98._M_current[1] = 4;
                                      local_e0.data_ =
                                           (pointer)((ulong)local_e0.data_ & 0xffffffff00000000);
                                      local_88._0_8_ = local_a0._M_current;
                                      andres::marray_detail::Geometry<std::allocator<unsigned_long>>
                                      ::
                                      Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((Geometry<std::allocator<unsigned_long>> *)
                                                 (local_88 + 8),local_98,
                                                 (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_98._M_current + 2),
                                                 (CoordinateOrder *)&local_e0,&andres::defaultOrder,
                                                 (allocator_type *)&local_e4);
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant((View<int,_true,_std::allocator<unsigned_long>_>
                                                     *)local_88);
                                      _Var5._M_current = (unsigned_long *)operator_new(0x10);
                                      _Var4._M_current = local_98._M_current;
                                      *_Var5._M_current = 0;
                                      _Var5._M_current[1] = 0;
                                      *_Var5._M_current = 2;
                                      _Var5._M_current[1] = 1;
                                      *local_98._M_current = 3;
                                      local_98._M_current[1] = 2;
                                      local_e0.data_ = (pointer)0x0;
                                      local_e0.geometry_.shape_ = (size_t *)0x0;
                                      local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                      local_e0.geometry_.strides_ = (size_t *)0x0;
                                      local_e0.geometry_.dimension_ = 0;
                                      local_e0.geometry_.size_ = 0;
                                      local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                                      local_e0.geometry_.isSimple_ = true;
                                      local_90._M_current = _Var5._M_current;
                                      andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                      testInvariant(&local_e0);
                                      andres::View<int,true,std::allocator<unsigned_long>>::
                                      view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                ((View<int,true,std::allocator<unsigned_long>> *)
                                                 local_88,_Var5,_Var4,&local_e0);
                                      if (local_e0.geometry_.size_ == 6) {
                                        if (local_e0.data_ == (pointer)0x0) {
                                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::runtime_error::runtime_error
                                                    ((runtime_error *)plVar9,"Assertion failed.");
                                          pcVar10 = std::runtime_error::~runtime_error;
                                          puVar13 = &std::runtime_error::typeinfo;
                                          goto LAB_0019f800;
                                        }
                                        if (local_e0.geometry_.dimension_ == 2) {
                                          lVar14 = 0;
                                          iVar2 = 0;
                                          do {
                                            iVar11 = (int)lVar14;
                                            lVar14 = (long)iVar11 + 3;
                                            sVar12 = 0;
                                            do {
                                              piVar6 = andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  operator()((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  &local_e0,sVar12,iVar2);
                                              if (*piVar6 != (&DAT_002328f0)[sVar12 + (long)iVar11])
                                              {
                                                plVar9 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar9,"test failed.")
                                                ;
                                                __cxa_throw(plVar9,&std::logic_error::typeinfo,
                                                            std::logic_error::~logic_error);
                                              }
                                              sVar12 = sVar12 + 1;
                                            } while (sVar12 != 3);
                                            bVar15 = iVar2 == 0;
                                            iVar2 = iVar2 + 1;
                                          } while (bVar15);
                                          operator_delete(local_e0.geometry_.shape_,
                                                          local_e0.geometry_.dimension_ * 0x18);
                                          operator_delete(local_90._M_current,0x10);
                                          operator_delete(local_78,local_60 * 0x18);
                                          operator_delete(local_98._M_current,0x10);
                                          _Var4._M_current = (unsigned_long *)operator_new(0x18);
                                          *_Var4._M_current = 0;
                                          _Var4._M_current[1] = 0;
                                          *_Var4._M_current = 3;
                                          _Var4._M_current[1] = 4;
                                          _Var4._M_current[2] = 2;
                                          local_88._0_8_ = local_a0._M_current;
                                          andres::marray_detail::
                                          Geometry<std::allocator<unsigned_long>>::
                                          Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((Geometry<std::allocator<unsigned_long>> *)
                                                     (local_88 + 8),_Var4,
                                                     (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e0)
                                          ;
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                          _Var5._M_current = (unsigned_long *)operator_new(0x18);
                                          *_Var5._M_current = 0;
                                          _Var5._M_current[1] = 0;
                                          _Var5._M_current[2] = 0;
                                          *_Var5._M_current = 1;
                                          _Var5._M_current[1] = 1;
                                          *_Var4._M_current = 1;
                                          _Var4._M_current[1] = 1;
                                          _Var4._M_current[2] = 1;
                                          local_e0.data_ = (pointer)0x0;
                                          local_e0.geometry_.shape_ = (size_t *)0x0;
                                          local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                          local_e0.geometry_.strides_ = (size_t *)0x0;
                                          local_e0.geometry_.dimension_ = 0;
                                          local_e0.geometry_.size_ = 0;
                                          local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                                          local_e0.geometry_.isSimple_ = true;
                                          andres::View<int,_true,_std::allocator<unsigned_long>_>::
                                          testInvariant(&local_e0);
                                          andres::View<int,true,std::allocator<unsigned_long>>::
                                          view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                    ((View<int,true,std::allocator<unsigned_long>> *
                                                     )local_88,_Var5,_Var4,&local_e0);
                                          if (local_e0.geometry_.size_ == 1) {
                                            if (local_e0.data_ == (pointer)0x0) {
                                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::runtime_error::runtime_error
                                                        ((runtime_error *)plVar9,"Assertion failed."
                                                        );
                                              pcVar10 = std::runtime_error::~runtime_error;
                                              puVar13 = &std::runtime_error::typeinfo;
                                              goto LAB_0019f832;
                                            }
                                            if (local_e0.geometry_.dimension_ == 3) {
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant(&local_e0);
                                              piVar1 = local_e0.data_;
                                              if ((local_e0.data_ == (pointer)0x0) ||
                                                 (local_e0.geometry_.dimension_ != 3)) {
                                                plVar9 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::runtime_error::runtime_error
                                                          ((runtime_error *)plVar9,
                                                           "Assertion failed.");
                                                pcVar10 = std::runtime_error::~runtime_error;
                                                puVar13 = &std::runtime_error::typeinfo;
LAB_0019f890:
                                                __cxa_throw(plVar9,puVar13,pcVar10);
                                              }
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              strides(&local_e0,0);
                                              sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,0,0);
                                              if (piVar1[sVar12] != 4) {
                                                plVar9 = (logic_error *)
                                                         __cxa_allocate_exception(0x10);
                                                std::logic_error::logic_error(plVar9,"test failed.")
                                                ;
                                                pcVar10 = std::logic_error::~logic_error;
                                                puVar13 = &std::logic_error::typeinfo;
                                                goto LAB_0019f890;
                                              }
                                              operator_delete(local_e0.geometry_.shape_,
                                                              local_e0.geometry_.dimension_ * 0x18);
                                              operator_delete(_Var5._M_current,0x18);
                                              operator_delete(local_78,local_60 * 0x18);
                                              operator_delete(_Var4._M_current,0x18);
                                              _Var4._M_current = (unsigned_long *)operator_new(0x18)
                                              ;
                                              *_Var4._M_current = 0;
                                              _Var4._M_current[1] = 0;
                                              *_Var4._M_current = 3;
                                              _Var4._M_current[1] = 4;
                                              _Var4._M_current[2] = 2;
                                              local_e0.data_ =
                                                   (pointer)((ulong)local_e0.data_ &
                                                            0xffffffff00000000);
                                              local_88._0_8_ = local_a0._M_current;
                                              andres::marray_detail::
                                              Geometry<std::allocator<unsigned_long>>::
                                              Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((Geometry<std::allocator<unsigned_long>> *)
                                                         (local_88 + 8),_Var4,
                                                         (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),
                                                  (CoordinateOrder *)&local_e0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_e4);
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                              _Var5._M_current = (unsigned_long *)operator_new(0x18)
                                              ;
                                              *_Var5._M_current = 0;
                                              _Var5._M_current[1] = 0;
                                              _Var5._M_current[2] = 0;
                                              *_Var5._M_current = 1;
                                              _Var5._M_current[1] = 1;
                                              *_Var4._M_current = 1;
                                              _Var4._M_current[1] = 1;
                                              _Var4._M_current[2] = 1;
                                              local_e0.data_ = (pointer)0x0;
                                              local_e0.geometry_.shape_ = (size_t *)0x0;
                                              local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                              local_e0.geometry_.strides_ = (size_t *)0x0;
                                              local_e0.geometry_.dimension_ = 0;
                                              local_e0.geometry_.size_ = 0;
                                              local_e0.geometry_.coordinateOrder_ = LastMajorOrder;
                                              local_e0.geometry_.isSimple_ = true;
                                              andres::
                                              View<int,_true,_std::allocator<unsigned_long>_>::
                                              testInvariant(&local_e0);
                                              andres::View<int,true,std::allocator<unsigned_long>>::
                                              view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                        ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                              if (local_e0.geometry_.size_ == 1) {
                                                if (local_e0.data_ == (pointer)0x0) {
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::runtime_error::runtime_error
                                                            ((runtime_error *)plVar9,
                                                             "Assertion failed.");
                                                  pcVar10 = std::runtime_error::~runtime_error;
                                                  puVar13 = &std::runtime_error::typeinfo;
                                                  goto LAB_0019f8c2;
                                                }
                                                if (local_e0.geometry_.dimension_ == 3) {
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_0019f920:
                                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,0,0);
                                                  if (piVar1[sVar12] != 10) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_0019f920;
                                                  }
                                                  operator_delete(local_e0.geometry_.shape_,
                                                                  local_e0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(_Var5._M_current,0x18);
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(_Var4._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 0;
                                                  _Var4._M_current[1] = 0;
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_88._0_8_ = local_a0._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e0)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *_Var4._M_current = 1;
                                                  _Var4._M_current[1] = 3;
                                                  _Var4._M_current[2] = 1;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 3) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019f952;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
LAB_0019f9b2:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,0,0);
                                                  if (piVar1[sVar12] == 4) {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    goto LAB_0019f9b2;
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,1,0);
                                                  if (piVar1[sVar12] == 7) {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    goto LAB_0019f9b2;
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,2,0);
                                                  if (piVar1[sVar12] == 10) {
                                                    operator_delete(local_e0.geometry_.shape_,
                                                                    local_e0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(_Var5._M_current,0x18);
                                                    operator_delete(local_78,local_60 * 0x18);
                                                    operator_delete(_Var4._M_current,0x18);
                                                    _Var4._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *_Var4._M_current = 0;
                                                    _Var4._M_current[1] = 0;
                                                    *_Var4._M_current = 3;
                                                    _Var4._M_current[1] = 4;
                                                    _Var4._M_current[2] = 2;
                                                    local_e0.data_ =
                                                         (pointer)((ulong)local_e0.data_ &
                                                                  0xffffffff00000000);
                                                    local_88._0_8_ = local_a0._M_current;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),
                                                  (CoordinateOrder *)&local_e0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *_Var4._M_current = 1;
                                                  _Var4._M_current[1] = 3;
                                                  _Var4._M_current[2] = 1;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 3) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019f9f2;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
LAB_0019fa52:
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
                                                  }
                                                  else {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,0,0);
                                                  if (piVar1[sVar12] == 10) {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    goto LAB_0019fa52;
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,1,0);
                                                  if (piVar1[sVar12] == 0xc) {
                                                    andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    goto LAB_0019fa52;
                                                  }
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar12 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,2,0);
                                                  if (piVar1[sVar12] == 0xe) {
                                                    operator_delete(local_e0.geometry_.shape_,
                                                                    local_e0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(_Var5._M_current,0x18);
                                                    operator_delete(local_78,local_60 * 0x18);
                                                    operator_delete(_Var4._M_current,0x18);
                                                    local_90._M_current =
                                                         (unsigned_long *)operator_new(0x18);
                                                    *local_90._M_current = 0;
                                                    local_90._M_current[1] = 0;
                                                    *local_90._M_current = 3;
                                                    local_90._M_current[1] = 4;
                                                    local_90._M_current[2] = 2;
                                                    local_88._0_8_ = local_a0._M_current;
                                                    andres::marray_detail::
                                                    Geometry<std::allocator<unsigned_long>>::
                                                                                                        
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),local_90,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_90._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e0)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_90._M_current;
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *local_90._M_current = 2;
                                                  local_90._M_current[1] = 3;
                                                  local_90._M_current[2] = 1;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  local_48 = _Var5._M_current;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 6) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019fa92;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      sVar12 = 0;
                                                      local_98._M_current = (unsigned_long *)0x0;
                                                      do {
                                                        iVar2 = (int)local_98._M_current;
                                                        local_98._M_current =
                                                             (unsigned_long *)((long)iVar2 + 2);
                                                        lVar14 = 0;
                                                        do {
                                                          andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_0019f072:
                                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,sVar12,0);
                                                  if (piVar1[sVar7 * lVar14 + sVar8] !=
                                                      (&DAT_00232910)[lVar14 + iVar2]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_0019f072;
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  } while (lVar14 == 1);
                                                  sVar12 = sVar12 + 1;
                                                  } while (sVar12 != 3);
                                                  operator_delete(local_e0.geometry_.shape_,
                                                                  local_e0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_48,0x18);
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_90._M_current,0x18);
                                                  local_90._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *local_90._M_current = 0;
                                                  local_90._M_current[1] = 0;
                                                  *local_90._M_current = 3;
                                                  local_90._M_current[1] = 4;
                                                  local_90._M_current[2] = 2;
                                                  local_e0.data_ =
                                                       (pointer)((ulong)local_e0.data_ &
                                                                0xffffffff00000000);
                                                  local_88._0_8_ = local_a0._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),local_90,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_90._M_current + 3),
                                                  (CoordinateOrder *)&local_e0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_90._M_current;
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *local_90._M_current = 2;
                                                  local_90._M_current[1] = 3;
                                                  local_90._M_current[2] = 1;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  local_48 = _Var5._M_current;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 6) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019fac4;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      sVar12 = 0;
                                                      local_98._M_current = (unsigned_long *)0x0;
                                                      do {
                                                        iVar2 = (int)local_98._M_current;
                                                        local_98._M_current =
                                                             (unsigned_long *)((long)iVar2 + 2);
                                                        lVar14 = 0;
                                                        do {
                                                          andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_0019f0d0:
                                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>(&local_e0,3,sVar12,0);
                                                  if (piVar1[sVar7 * lVar14 + sVar8] !=
                                                      (&DAT_00232930)[lVar14 + iVar2]) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_0019f0d0;
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  } while (lVar14 == 1);
                                                  sVar12 = sVar12 + 1;
                                                  } while (sVar12 != 3);
                                                  operator_delete(local_e0.geometry_.shape_,
                                                                  local_e0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_48,0x18);
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_90._M_current,0x18);
                                                  local_40._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *local_40._M_current = 0;
                                                  local_40._M_current[1] = 0;
                                                  *local_40._M_current = 3;
                                                  local_40._M_current[1] = 4;
                                                  local_40._M_current[2] = 2;
                                                  local_88._0_8_ = local_a0._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),local_40,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(local_40._M_current + 3),&andres::defaultOrder,
                                                  &andres::defaultOrder,(allocator_type *)&local_e0)
                                                  ;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_40._M_current;
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *local_40._M_current = 2;
                                                  local_40._M_current[1] = 2;
                                                  local_40._M_current[2] = 2;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  local_38 = _Var5._M_current;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 8) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019faf6;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      local_98._M_current = (unsigned_long *)0x0;
                                                      uVar3 = 0;
                                                      do {
                                                        local_90._M_current =
                                                             (unsigned_long *)(ulong)uVar3;
                                                        local_48 = (unsigned_long *)
                                                                   CONCAT44(local_48._4_4_,uVar3 + 4
                                                                           );
                                                        sVar12 = 0;
                                                        do {
                                                          iVar2 = (int)local_90._M_current;
                                                          local_90._M_current =
                                                               (unsigned_long *)(ulong)(iVar2 + 2);
                                                          lVar14 = 0;
                                                          do {
                                                            andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_0019ef52:
                                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e0,3,sVar12,
                                                             (int)local_98._M_current);
                                                  if (piVar1[sVar7 * lVar14 + sVar8] !=
                                                      *(int *)(&DAT_00232ab0 +
                                                              (long)iVar2 * 4 + lVar14 * 4)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_0019ef52;
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  } while (lVar14 == 1);
                                                  bVar15 = sVar12 == 0;
                                                  sVar12 = sVar12 + 1;
                                                  } while (bVar15);
                                                  iVar2 = (int)local_98._M_current;
                                                  local_98._M_current =
                                                       (unsigned_long *)(ulong)(iVar2 + 1);
                                                  uVar3 = (uint)local_48;
                                                  } while (iVar2 == 0);
                                                  operator_delete(local_e0.geometry_.shape_,
                                                                  local_e0.geometry_.dimension_ *
                                                                  0x18);
                                                  operator_delete(local_38,0x18);
                                                  operator_delete(local_78,local_60 * 0x18);
                                                  operator_delete(local_40._M_current,0x18);
                                                  _Var4._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  *_Var4._M_current = 0;
                                                  _Var4._M_current[1] = 0;
                                                  *_Var4._M_current = 3;
                                                  _Var4._M_current[1] = 4;
                                                  _Var4._M_current[2] = 2;
                                                  local_e0.data_ =
                                                       (pointer)((ulong)local_e0.data_ &
                                                                0xffffffff00000000);
                                                  local_88._0_8_ = local_a0._M_current;
                                                  local_a0._M_current = _Var4._M_current;
                                                  andres::marray_detail::
                                                  Geometry<std::allocator<unsigned_long>>::
                                                  Geometry<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  Geometry<std::allocator<unsigned_long>> *)
                                                  (local_88 + 8),_Var4,
                                                  (
                                                  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                                  )(_Var4._M_current + 3),
                                                  (CoordinateOrder *)&local_e0,&andres::defaultOrder
                                                  ,(allocator_type *)&local_e4);
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant((
                                                  View<int,_true,_std::allocator<unsigned_long>_> *)
                                                  local_88);
                                                  _Var5._M_current =
                                                       (unsigned_long *)operator_new(0x18);
                                                  _Var4._M_current = local_a0._M_current;
                                                  *_Var5._M_current = 0;
                                                  _Var5._M_current[1] = 0;
                                                  _Var5._M_current[2] = 0;
                                                  *_Var5._M_current = 1;
                                                  _Var5._M_current[1] = 1;
                                                  *local_a0._M_current = 2;
                                                  local_a0._M_current[1] = 2;
                                                  local_a0._M_current[2] = 2;
                                                  local_e0.data_ = (pointer)0x0;
                                                  local_e0.geometry_.shape_ = (size_t *)0x0;
                                                  local_e0.geometry_.shapeStrides_ = (size_t *)0x0;
                                                  local_e0.geometry_.strides_ = (size_t *)0x0;
                                                  local_e0.geometry_.dimension_ = 0;
                                                  local_e0.geometry_.size_ = 0;
                                                  local_e0.geometry_.coordinateOrder_ =
                                                       LastMajorOrder;
                                                  local_e0.geometry_.isSimple_ = true;
                                                  local_40._M_current = _Var5._M_current;
                                                  andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  andres::
                                                  View<int,true,std::allocator<unsigned_long>>::
                                                  view<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                                                            ((
                                                  View<int,true,std::allocator<unsigned_long>> *)
                                                  local_88,_Var5,_Var4,&local_e0);
                                                  if (local_e0.geometry_.size_ == 8) {
                                                    if (local_e0.data_ == (pointer)0x0) {
                                                      plVar9 = (logic_error *)
                                                               __cxa_allocate_exception(0x10);
                                                      std::runtime_error::runtime_error
                                                                ((runtime_error *)plVar9,
                                                                 "Assertion failed.");
                                                      pcVar10 = std::runtime_error::~runtime_error;
                                                      puVar13 = &std::runtime_error::typeinfo;
                                                      goto LAB_0019fb28;
                                                    }
                                                    if (local_e0.geometry_.dimension_ == 3) {
                                                      local_98._M_current = (unsigned_long *)0x0;
                                                      uVar3 = 0;
                                                      do {
                                                        local_90._M_current =
                                                             (unsigned_long *)(ulong)uVar3;
                                                        local_48 = (unsigned_long *)
                                                                   CONCAT44(local_48._4_4_,uVar3 + 4
                                                                           );
                                                        sVar12 = 0;
                                                        do {
                                                          iVar2 = (int)local_90._M_current;
                                                          local_90._M_current =
                                                               (unsigned_long *)(ulong)(iVar2 + 2);
                                                          lVar14 = 0;
                                                          do {
                                                            andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  testInvariant(&local_e0);
                                                  piVar1 = local_e0.data_;
                                                  if ((local_e0.data_ == (pointer)0x0) ||
                                                     (local_e0.geometry_.dimension_ != 3)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::runtime_error::runtime_error
                                                              ((runtime_error *)plVar9,
                                                               "Assertion failed.");
                                                    pcVar10 = std::runtime_error::~runtime_error;
                                                    puVar13 = &std::runtime_error::typeinfo;
LAB_0019efb0:
                                                    __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  sVar7 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  strides(&local_e0,0);
                                                  sVar8 = andres::
                                                  View<int,_true,_std::allocator<unsigned_long>_>::
                                                  elementAccessHelper<int>
                                                            (&local_e0,3,sVar12,
                                                             (int)local_98._M_current);
                                                  if (piVar1[sVar7 * lVar14 + sVar8] !=
                                                      *(int *)(&DAT_00232ad0 +
                                                              (long)iVar2 * 4 + lVar14 * 4)) {
                                                    plVar9 = (logic_error *)
                                                             __cxa_allocate_exception(0x10);
                                                    std::logic_error::logic_error
                                                              (plVar9,"test failed.");
                                                    pcVar10 = std::logic_error::~logic_error;
                                                    puVar13 = &std::logic_error::typeinfo;
                                                    goto LAB_0019efb0;
                                                  }
                                                  lVar14 = lVar14 + 1;
                                                  } while (lVar14 == 1);
                                                  bVar15 = sVar12 == 0;
                                                  sVar12 = sVar12 + 1;
                                                  } while (bVar15);
                                                  iVar2 = (int)local_98._M_current;
                                                  local_98._M_current =
                                                       (unsigned_long *)(ulong)(iVar2 + 1);
                                                  uVar3 = (uint)local_48;
                                                  if (iVar2 != 0) {
                                                    operator_delete(local_e0.geometry_.shape_,
                                                                    local_e0.geometry_.dimension_ *
                                                                    0x18);
                                                    operator_delete(local_40._M_current,0x18);
                                                    operator_delete(local_78,local_60 * 0x18);
                                                    operator_delete(local_a0._M_current,0x18);
                                                    return;
                                                  }
                                                  } while( true );
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019fb28:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019faf6:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019fac4:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019fa92:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019f9f2:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
                                                  }
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                  }
                                                  }
                                                  plVar9 = (logic_error *)
                                                           __cxa_allocate_exception(0x10);
                                                  std::logic_error::logic_error
                                                            (plVar9,"test failed.");
                                                  pcVar10 = std::logic_error::~logic_error;
                                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019f952:
                                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                                }
                                              }
                                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10)
                                              ;
                                              std::logic_error::logic_error(plVar9,"test failed.");
                                              pcVar10 = std::logic_error::~logic_error;
                                              puVar13 = &std::logic_error::typeinfo;
LAB_0019f8c2:
                                              __cxa_throw(plVar9,puVar13,pcVar10);
                                            }
                                          }
                                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                          std::logic_error::logic_error(plVar9,"test failed.");
                                          pcVar10 = std::logic_error::~logic_error;
                                          puVar13 = &std::logic_error::typeinfo;
LAB_0019f832:
                                          __cxa_throw(plVar9,puVar13,pcVar10);
                                        }
                                      }
                                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                      std::logic_error::logic_error(plVar9,"test failed.");
                                      pcVar10 = std::logic_error::~logic_error;
                                      puVar13 = &std::logic_error::typeinfo;
LAB_0019f800:
                                      __cxa_throw(plVar9,puVar13,pcVar10);
                                    }
                                  }
                                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                                  std::logic_error::logic_error(plVar9,"test failed.");
                                  pcVar10 = std::logic_error::~logic_error;
                                  puVar13 = &std::logic_error::typeinfo;
LAB_0019f7ce:
                                  __cxa_throw(plVar9,puVar13,pcVar10);
                                }
                              }
                              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                              std::logic_error::logic_error(plVar9,"test failed.");
                              pcVar10 = std::logic_error::~logic_error;
                              puVar13 = &std::logic_error::typeinfo;
LAB_0019f79c:
                              __cxa_throw(plVar9,puVar13,pcVar10);
                            }
                          }
                          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                          std::logic_error::logic_error(plVar9,"test failed.");
                          pcVar10 = std::logic_error::~logic_error;
                          puVar13 = &std::logic_error::typeinfo;
LAB_0019f76a:
                          __cxa_throw(plVar9,puVar13,pcVar10);
                        }
                      }
                      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                      std::logic_error::logic_error(plVar9,"test failed.");
                      pcVar10 = std::logic_error::~logic_error;
                      puVar13 = &std::logic_error::typeinfo;
LAB_0019f706:
                      __cxa_throw(plVar9,puVar13,pcVar10);
                    }
                  }
                  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
                  std::logic_error::logic_error(plVar9,"test failed.");
                  pcVar10 = std::logic_error::~logic_error;
                  puVar13 = &std::logic_error::typeinfo;
LAB_0019f6a2:
                  __cxa_throw(plVar9,puVar13,pcVar10);
                }
              }
              plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
              std::logic_error::logic_error(plVar9,"test failed.");
              pcVar10 = std::logic_error::~logic_error;
              puVar13 = &std::logic_error::typeinfo;
LAB_0019f670:
              __cxa_throw(plVar9,puVar13,pcVar10);
            }
          }
          plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
          std::logic_error::logic_error(plVar9,"test failed.");
          pcVar10 = std::logic_error::~logic_error;
          puVar13 = &std::logic_error::typeinfo;
LAB_0019f63e:
          __cxa_throw(plVar9,puVar13,pcVar10);
        }
      }
      plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(plVar9,"test failed.");
      pcVar10 = std::logic_error::~logic_error;
      puVar13 = &std::logic_error::typeinfo;
LAB_0019f5da:
      __cxa_throw(plVar9,puVar13,pcVar10);
    }
  }
  plVar9 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(plVar9,"test failed.");
  pcVar10 = std::logic_error::~logic_error;
  puVar13 = &std::logic_error::typeinfo;
LAB_0019f576:
  __cxa_throw(plVar9,puVar13,pcVar10);
}

Assistant:

void ViewTest::subViewsTest(){
    // 1D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 1 && s.dimension()==1
            );
            test(s(0)==4);

        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
        {
            std::vector<std::size_t> shape(1);
            shape[0] = 24; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(1);
            base[0] = 4;
            shape[0] = 3;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(),  s);

            test(s.size() == 3 && s.dimension()==1
            );
            test(s(0)==4 && s(1)==5 && s(2)==6);
        }
    }
    // 2D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==14);
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =2;
            base[1] =2;
            shape[0] = 1; 
            shape[1] = 1;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==2
            );
            test(s(0,0)==10);
        }     
        // 1D sub-view
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==6 && s(0,2)==12 && s(0,3)==18 );
        } 
        {
            std::vector<std::size_t> shape(2);
            shape[0] = 6; 
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] =0;
            base[1] =0;
            shape[0] = 1; 
            shape[1] = 4;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 4 && s.dimension()==2
            );
            test(s(0,0)==0 && s(0,1)==1 && s(0,2)==2 && s(0,3)==3);
        } 
        // 2D sub-view
        {
            int list[] = {8, 9, 10, 14, 15, 16};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {9, 13, 17, 10, 14, 18};
            std::vector<std::size_t> shape(2);
            shape[0] = 6;
            shape[1] = 4; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(2);
            base[0] = 2;
            base[1] = 1;
            shape[0] = 3;
            shape[1] = 2; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==2
            );
            int index = 0; 
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 3; ++x){
                test(s(x, y) == list[index]);
                ++index;
            }
        } 
    }
    // 3D with...
    {
        // scalar sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==4);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 1;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 1 && s.dimension()==3
            );
            test(s(0,0,0)==10);
        }
        // 1D sub-view
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==4 && s(0,1,0)==7 && s(0,2,0)==10);
        }
        {
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 1;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 3 && s.dimension()==3
            );
            test(s(0,0,0)==10 && s(0,1,0)==12 && s(0,2,0)==14);
        }
        // 2D sub-view
        {
            int list[] = {4, 5, 7, 8, 10, 11};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        {
            int list[] = {10, 18, 12, 20, 14, 22};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4;
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0; 
            shape[0] = 2;
            shape[1] = 3;
            shape[2] = 1; 
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 6 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 1; ++z)
            for(int y = 0; y < 3; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        }
        // 3D sub-view
        {
            int list[] = {4, 5, 7, 8, 16, 17, 19, 20};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
        {
            int list[] = {10, 18, 12, 20, 11, 19, 13, 21};
            std::vector<std::size_t> shape(3);
            shape[0] = 3;
            shape[1] = 4; 
            shape[2] = 2; 
            andres::View<int, constTarget> v(shape.begin(), shape.end(), data_, andres::FirstMajorOrder);
            std::vector<std::size_t> base(3);
            base[0] = 1;
            base[1] = 1;
            base[2] = 0;
            shape[0] =2;
            shape[1] =2;
            shape[2] =2;
            andres::View<int, constTarget> s;
            v.view(base.begin(), shape.begin(), s);

            test(s.size() == 8 && s.dimension()==3
            );
            int index = 0; 
            for(int z = 0; z < 2; ++z)
            for(int y = 0; y < 2; ++y)
            for(int x = 0; x < 2; ++x){
                test(s(x, y, z) == list[index]);
                ++index;
            }
        } 
    }
}